

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.h
# Opt level: O1

uint8_t * cbor_map_parse<cdnsBlockTables>(uint8_t *in,uint8_t *in_max,cdnsBlockTables *v,int *err)

{
  byte bVar1;
  int64_t iVar2;
  byte *in_00;
  uint8_t *old_in;
  int64_t val;
  int64_t inner_val;
  int64_t local_40;
  ulong local_38;
  
  bVar1 = *in;
  in_00 = cbor_get_number(in,in_max,&local_40);
  iVar2 = local_40;
  if ((in_00 != (byte *)0x0) && ((bVar1 & 0xe0) == 0xa0)) {
    if (local_40 == -1) {
      local_40 = 0xffffffff;
    }
    if (in_max <= in_00) {
      return in_00;
    }
    if (in_00 == (byte *)0x0) {
      return (uint8_t *)0x0;
    }
    if (local_40 < 1) {
      return in_00;
    }
    while (bVar1 = *in_00, bVar1 != 0xff) {
      old_in = cbor_get_number(in_00,in_max,(int64_t *)&local_38);
      if ((old_in == (uint8_t *)0x0) || (bVar1 >> 5 != 1 && 0x1f < bVar1)) {
        *err = -3;
        in_00 = (byte *)0x0;
      }
      else {
        if (bVar1 >> 5 == 1) {
          local_38 = ~local_38;
        }
        in_00 = cdnsBlockTables::parse_map_item(v,old_in,in_max,local_38,err);
        local_40 = local_40 + -1;
      }
      if (in_max <= in_00) {
        return in_00;
      }
      if (in_00 == (byte *)0x0) {
        return (uint8_t *)0x0;
      }
      if (local_40 < 1) {
        return in_00;
      }
    }
    if (iVar2 == -1) {
      return in_00 + 1;
    }
  }
  *err = -3;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* cbor_map_parse(uint8_t* in, uint8_t const* in_max, InnerClass * v, int* err)
{

    int outer_type = CBOR_CLASS(*in);
    int64_t val;
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_MAP) {
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                if (is_undef) {
                    in++;
                }
                else {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (in == NULL || (inner_type != CBOR_T_UINT && inner_type != CBOR_T_NINT)) {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (inner_type == CBOR_T_NINT) {
                        inner_val = -(inner_val + 1);
                    }
                    in = v->parse_map_item(in, in_max, inner_val, err);
                    val--;
                }
            }
        }
    }

    return in;
}